

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O0

void __thiscall rengine::TransformNode::setMatrix_rotateAroundZ(TransformNode *this,float radians)

{
  mat4 m;
  mat4 local_58;
  float local_14;
  TransformNode *pTStack_10;
  float radians_local;
  TransformNode *this_local;
  
  local_14 = radians;
  pTStack_10 = this;
  mat4::rotateAroundZ(&local_58,radians);
  m.m[2] = local_58.m[2];
  m.m[3] = local_58.m[3];
  m.m[0] = local_58.m[0];
  m.m[1] = local_58.m[1];
  m.m[4] = local_58.m[4];
  m.m[5] = local_58.m[5];
  m.m[6] = local_58.m[6];
  m.m[7] = local_58.m[7];
  m.m[8] = local_58.m[8];
  m.m[9] = local_58.m[9];
  m.m[10] = local_58.m[10];
  m.m[0xb] = local_58.m[0xb];
  m.m[0xc] = local_58.m[0xc];
  m.m[0xd] = local_58.m[0xd];
  m.m[0xe] = local_58.m[0xe];
  m.m[0xf] = local_58.m[0xf];
  m.type = local_58.type;
  setMatrix(this,m);
  return;
}

Assistant:

void setMatrix_rotateAroundZ(float radians) { setMatrix(mat4::rotateAroundZ(radians)); }